

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-util.c
# Opt level: O2

void quit(char *str)

{
  if (quit_aux != (_func_void_char_ptr *)0x0) {
    (*quit_aux)(str);
  }
  if (str == (char *)0x0) {
    exit(0);
  }
  plog(str);
  exit(1);
}

Assistant:

void quit(const char *str)
{
	/* Attempt to use the aux function */
	if (quit_aux) (*quit_aux)(str);

	/* Success */
	if (!str) exit(EXIT_SUCCESS);

	/* Send the string to plog() */
	plog(str);

	/* Failure */
	exit(EXIT_FAILURE);
}